

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O1

ostream * operator<<(ostream *strm,Company *obj)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  
  Company::arrange(obj);
  poVar2 = operator<<((ostream *)&std::cout,obj->boss);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  iVar1 = Boss::getNumberOfEmployees(obj->boss);
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      poVar2 = operator<<(strm,obj->employees[lVar3]);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      lVar3 = lVar3 + 1;
      iVar1 = Boss::getNumberOfEmployees(obj->boss);
    } while (lVar3 < iVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"budget: ",8);
  std::ostream::operator<<((ostream *)strm,obj->budget);
  return strm;
}

Assistant:

ostream &operator<<(ostream &strm, Company &obj) {
    obj.arrange();
    cout << *obj.boss << endl;
    for (int i = 0; i < obj.boss->getNumberOfEmployees(); ++i) {
        strm << *obj.employees[i] << endl;
    }
    cout << "budget: ";
    strm << obj.budget;
    return strm;
}